

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::NotifyFree(Recycler *this,char *address,size_t size)

{
  bool bVar1;
  BOOL BVar2;
  ConfigFlagsTable *pCVar3;
  size_t nBytes;
  size_t size_local;
  char *address_local;
  Recycler *this_local;
  
  pCVar3 = GetRecyclerFlagsTable(this);
  if ((pCVar3->Verbose & 1U) != 0) {
    pCVar3 = GetRecyclerFlagsTable(this);
    bVar1 = Js::Phases::IsEnabled(&pCVar3->Trace,RecyclerPhase);
    if (bVar1) {
      Output::Print(L"Sweeping object %p\n",address);
    }
  }
  bVar1 = BinaryFeatureControl::RecyclerTest();
  if ((bVar1) && (this->checkFn != (_func_BOOL_char_ptr_size_t *)0x0)) {
    (*this->checkFn)(address,size);
  }
  RecyclerMemoryTracking::ReportFree(this,address,size);
  nBytes = HeapInfo::GetAlignedSizeNoCheck(size);
  HeapInfo::IsSmallBlockAllocation(nBytes);
  BVar2 = VerifyEnabled(this);
  if (BVar2 != 0) {
    VerifyCheckPad(this,address,size);
  }
  if ((DAT_01eca381 & 1) == 0) {
    TrackFree(this,address,size);
  }
  (this->collectionStats).objectSweptCount = (this->collectionStats).objectSweptCount + 1;
  (this->collectionStats).objectSweptBytes = size + (this->collectionStats).objectSweptBytes;
  if ((this->isForceSweeping & 1U) == 0) {
    (this->collectionStats).objectSweptFreeListCount =
         (this->collectionStats).objectSweptFreeListCount + 1;
    (this->collectionStats).objectSweptFreeListBytes =
         size + (this->collectionStats).objectSweptFreeListBytes;
  }
  return;
}

Assistant:

void
Recycler::NotifyFree(__in char *address, size_t size)
{
    RecyclerVerboseTrace(GetRecyclerFlagsTable(), _u("Sweeping object %p\n"), address);

#ifdef RECYCLER_TEST_SUPPORT
    if (BinaryFeatureControl::RecyclerTest())
    {
        if (checkFn != NULL)
            checkFn(address, size);
    }
#endif

#ifdef ENABLE_JS_ETW
    if (EventEnabledJSCRIPT_RECYCLER_FREE_MEMORY())
    {
        AppendFreeMemoryETWRecord(address, (UINT)size);
    }
#endif

    RecyclerMemoryTracking::ReportFree(this, address, size);
    RECYCLER_PERF_COUNTER_DEC(LiveObject);
    RECYCLER_PERF_COUNTER_SUB(LiveObjectSize, size);
    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, size);

    if (HeapInfo::IsSmallBlockAllocation(HeapInfo::GetAlignedSizeNoCheck(size)))
    {
        RECYCLER_PERF_COUNTER_DEC(SmallHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockLiveObjectSize, size);
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockFreeObjectSize, size);
    }
    else
    {
        RECYCLER_PERF_COUNTER_DEC(LargeHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockLiveObjectSize, size);
        RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockFreeObjectSize, size);
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (this->VerifyEnabled())
    {
        VerifyCheckPad(address, size);
    }
#endif

#ifdef PROFILE_RECYCLER_ALLOC
    if (!CONFIG_FLAG(KeepRecyclerTrackData))
    {
        TrackFree(address, size);
    }
#endif

#ifdef RECYCLER_STATS
    collectionStats.objectSweptCount++;
    collectionStats.objectSweptBytes += size;

    if (!isForceSweeping)
    {
        collectionStats.objectSweptFreeListCount++;
        collectionStats.objectSweptFreeListBytes += size;
    }
#endif
}